

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<kj::Directory,_std::nullptr_t> __thiscall
kj::newInMemoryDirectory(kj *this,Clock *clock,InMemoryFileFactory *fileFactory)

{
  Directory *extraout_RDX;
  Own<kj::Directory,_std::nullptr_t> OVar1;
  Own<kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t> local_30;
  InMemoryFileFactory *local_20;
  InMemoryFileFactory *fileFactory_local;
  Clock *clock_local;
  
  local_20 = fileFactory;
  fileFactory_local = (InMemoryFileFactory *)clock;
  clock_local = (Clock *)this;
  atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&,kj::InMemoryFileFactory_const&>
            ((kj *)&local_30,clock,fileFactory);
  Own<kj::Directory,decltype(nullptr)>::Own<kj::(anonymous_namespace)::InMemoryDirectory,void>
            ((Own<kj::Directory,decltype(nullptr)> *)this,&local_30);
  Own<kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t>::~Own(&local_30);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<Directory> newInMemoryDirectory(const Clock& clock, const InMemoryFileFactory& fileFactory) {
  return atomicRefcounted<InMemoryDirectory>(clock, fileFactory);
}